

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O0

size_t __thiscall
OpenSSLWrapper::SslConnection::SslRead
          (SslConnection *this,uint8_t *szBuffer,size_t nBufLen,int *iErrorHint)

{
  bool bVar1;
  int iVar2;
  runtime_error *this_00;
  int *piVar3;
  ulong uVar4;
  size_t sStack_48;
  int iResult;
  size_t nRead;
  int *local_30;
  int *iErrorHint_local;
  size_t nBufLen_local;
  uint8_t *szBuffer_local;
  SslConnection *this_local;
  
  local_30 = iErrorHint;
  iErrorHint_local = (int *)nBufLen;
  nBufLen_local = (size_t)szBuffer;
  szBuffer_local = (uint8_t *)this;
  if (this->m_ssl == (SSL *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Not Initialized");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::mutex::lock(&this->m_mxSsl);
  ERR_clear_error();
  sStack_48 = 0;
  iVar2 = SSL_read_ex(this->m_ssl,nBufLen_local,iErrorHint_local,&stack0xffffffffffffffb8);
  if (iVar2 < 1) {
    iVar2 = SSL_get_error((SSL *)this->m_ssl,iVar2);
    if (local_30 != (int *)0x0) {
      *local_30 = iVar2;
    }
    std::mutex::unlock(&this->m_mxSsl);
    switch(iVar2) {
    case 2:
      this->m_iWantState = this->m_iWantState | 1;
      break;
    case 3:
      this->m_iWantState = this->m_iWantState | 2;
      break;
    case 5:
      piVar3 = __errno_location();
      if ((*piVar3 == 0) && (uVar4 = ERR_peek_error(), uVar4 == 0)) {
        return 0;
      }
    default:
      this->m_iShutDownFlag = 1;
      bVar1 = std::function::operator_cast_to_bool((function *)&this->m_fError);
      if (bVar1) {
        std::function<void_()>::operator()(&this->m_fError);
      }
      break;
    case 6:
      this->m_bZeroReceived = true;
      ShutDownConnection(this,local_30);
    }
    return 0;
  }
  std::mutex::unlock(&this->m_mxSsl);
  return sStack_48;
}

Assistant:

size_t SslConnection::SslRead(uint8_t* szBuffer, size_t nBufLen, int* iErrorHint/* = nullptr*/)
    {
        if (nullptr == m_ssl)
            throw runtime_error("Not Initialized");

        //OSSL_HANDSHAKE_STATE hsState = SSL_get_state(m_ssl);
        //if (hsState != TLS_ST_OK)
        //    OutputDebugString(wstring(L"SSL invalid state: " + to_wstring(hsState) + L" on ssl context: " + to_wstring(reinterpret_cast<size_t>(m_ssl)) + L"\r\n").c_str());

        m_mxSsl.lock();

        ERR_clear_error();
        size_t nRead = 0;
        int iResult = SSL_read_ex(m_ssl, szBuffer, nBufLen, &nRead);
        if (iResult <= 0)
        {
            iResult = SSL_get_error(m_ssl, iResult);
            if (iErrorHint != nullptr)
                *iErrorHint = iResult;
            m_mxSsl.unlock();

            switch (iResult)
            {
            case SSL_ERROR_WANT_READ:
                m_iWantState |= 1; break;
            case SSL_ERROR_WANT_WRITE:
                m_iWantState |= 2; break;
            case SSL_ERROR_ZERO_RETURN:
                m_bZeroReceived = true;
                ShutDownConnection(iErrorHint);
                break;
            case SSL_ERROR_SYSCALL:
                iResult = errno;
                if (iResult == 0 && ERR_peek_error() == 0)    // if errno and ERR_peack_error are both 0, we not having really an error, and give it a other shoot
                    break;
                [[fallthrough]];
            default:
                m_iShutDownFlag = 1;
                if (m_fError)
                    m_fError();
            }

            return 0;
        }
        m_mxSsl.unlock();

        return nRead;
    }